

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasmlistener.h
# Opt level: O3

void __thiscall apngasm::listener::APNGAsmListener::~APNGAsmListener(APNGAsmListener *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

class APNGASM_DECLSPEC APNGAsmListener : public IAPNGAsmListener {
public:
  // Called before add frame.
  // Return true if can add.
  bool onPreAddFrame(const std::string &filePath, unsigned int delayNum,
                     unsigned int delayDen) const;

  // Called before add frame.
  // Return true if can add.
  bool onPreAddFrame(const APNGFrame &frame) const;

  // Called after add frame.
  void onPostAddFrame(const std::string &filePath, unsigned int delayNum,
                      unsigned int delayDen) const;

  // Called after add frame.
  void onPostAddFrame(const APNGFrame &frame) const;

  // Called before save.
  // Return true if can save.
  bool onPreSave(const std::string &filePath) const;

  // Called after save.
  void onPostSave(const std::string &filePath) const;

  // Called when create output path of png file.
  // Return output path.
  const std::string onCreatePngPath(const std::string &outputDir,
                                    int index) const;

}